

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_test.c
# Opt level: O3

void * enc_test(void *arg)

{
  MpiEncTestData *p;
  long *plVar1;
  MPP_RET MVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  MppPollType timeout;
  
  lVar4 = *arg;
  iVar3 = *(int *)(lVar4 + 0xe4);
  if (iVar3 == 0) {
    _mpp_log_l(4,"mpi_enc_test","%s start\n",0,*(undefined8 *)((long)arg + 8));
  }
  p = (MpiEncTestData *)((long)arg + 0x20);
  MVar2 = test_ctx_init((MpiEncMultiCtxInfo *)arg);
  if (MVar2 == MPP_OK) {
    MVar2 = mpp_buffer_group_get((long)arg + 0x1270,0x20003,0,"mpi_enc_test","enc_test");
    if (MVar2 != MPP_OK) {
      pcVar7 = "failed to get mpp buffer group ret %d\n";
      goto LAB_00108c31;
    }
    MVar2 = mpp_buffer_get_with_tag
                      (*(undefined8 *)((long)arg + 0x1270),(long)arg + 0x1278,
                       *(long *)((long)arg + 0x12d0) + *(long *)((long)arg + 0x12d8),"mpi_enc_test",
                       "enc_test");
    if (MVar2 != MPP_OK) {
      pcVar7 = "failed to get buffer for input frame ret %d\n";
      goto LAB_00108c31;
    }
    MVar2 = mpp_buffer_get_with_tag
                      (*(undefined8 *)((long)arg + 0x1270),(long)arg + 0x1280,
                       *(undefined8 *)((long)arg + 0x12d8),"mpi_enc_test","enc_test");
    if (MVar2 != MPP_OK) {
      pcVar7 = "failed to get buffer for output packet ret %d\n";
      goto LAB_00108c31;
    }
    MVar2 = mpp_buffer_get_with_tag
                      (*(undefined8 *)((long)arg + 0x1270),(long)arg + 0x1288,
                       *(undefined8 *)((long)arg + 0x12e0),"mpi_enc_test","enc_test");
    if (MVar2 != MPP_OK) {
      pcVar7 = "failed to get buffer for motion info output packet ret %d\n";
      goto LAB_00108c31;
    }
    plVar1 = (long *)((long)arg + 0x28);
    MVar2 = mpp_create(p,plVar1);
    if (MVar2 == MPP_OK) {
      if (iVar3 == 0) {
        _mpp_log_l(4,"mpi_enc_test","%p encoder test start w %d h %d type %d\n",0,
                   *(undefined8 *)((long)arg + 0x20),*(undefined4 *)((long)arg + 0x1298),
                   *(undefined4 *)((long)arg + 0x129c),*(undefined4 *)((long)arg + 0x12ac));
      }
      iVar3 = (**(code **)(*plVar1 + 0x70))(p->ctx,0x200007,&timeout);
      if (iVar3 != 0) {
        _mpp_log_l(2,"mpi_enc_test","mpi control set output timeout %d ret %d\n",0,0xffffffff,iVar3)
        ;
        goto LAB_00108c47;
      }
      if (*(int *)(lVar4 + 0x108) != 0) {
        kmpp_cfg_init((MpiEncMultiCtxInfo *)arg);
      }
      MVar2 = mpp_init(*(undefined8 *)((long)arg + 0x20),1,*(undefined4 *)((long)arg + 0x12ac));
      if (MVar2 != MPP_OK) {
        pcVar7 = "mpp_init failed ret %d\n";
        goto LAB_00108d80;
      }
      MVar2 = mpp_enc_cfg_init((undefined8 *)((long)arg + 0x70));
      if (MVar2 == MPP_OK) {
        MVar2 = (**(code **)(*plVar1 + 0x70))(p->ctx,0x320002,*(undefined8 *)((long)arg + 0x70));
        if (MVar2 == MPP_OK) {
          MVar2 = test_mpp_enc_cfg_setup((MpiEncMultiCtxInfo *)arg);
          if (MVar2 == MPP_OK) {
            lVar4 = mpp_time();
            MVar2 = test_mpp_run((MpiEncMultiCtxInfo *)arg);
            lVar5 = mpp_time();
            if (MVar2 == MPP_OK) {
              iVar3 = (**(code **)(*plVar1 + 0x68))(p->ctx);
              if (iVar3 == 0) {
                *(long *)((long)arg + 0x1380) = lVar5 - lVar4;
                iVar3 = *(int *)((long)arg + 0x44);
                *(int *)((long)arg + 5000) = iVar3;
                *(long *)((long)arg + 0x1390) = *(long *)((long)arg + 0x48);
                *(float *)((long)arg + 0x1370) = ((float)iVar3 * 1e+06) / (float)(lVar5 - lVar4);
                *(ulong *)((long)arg + 0x1378) =
                     (ulong)((long)(*(int *)((long)arg + 0x1320) / *(int *)((long)arg + 0x131c)) *
                             *(long *)((long)arg + 0x48) * 8) / (ulong)(long)iVar3;
                *(long *)((long)arg + 0x1398) =
                     *(long *)((long)arg + 0x1368) - *(long *)((long)arg + 0x1360);
              }
              else {
                _mpp_log_l(2,"mpi_enc_test","mpi->reset failed\n",0);
              }
              goto LAB_00108c47;
            }
            pcVar7 = "test mpp run failed ret %d\n";
            pcVar6 = "enc_test";
            goto LAB_00108c40;
          }
          pcVar7 = "test mpp setup failed ret %d\n";
        }
        else {
          pcVar7 = "get enc cfg failed ret %d\n";
        }
      }
      else {
        pcVar7 = "mpp_enc_cfg_init failed ret %d\n";
      }
      goto LAB_00108c31;
    }
    pcVar7 = "mpp_create failed ret %d\n";
LAB_00108d80:
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar7 = "test data init failed ret %d\n";
LAB_00108c31:
    pcVar6 = "enc_test";
  }
LAB_00108c40:
  _mpp_log_l(2,"mpi_enc_test",pcVar7,pcVar6,MVar2);
LAB_00108c47:
  if (p->ctx != (MppCtx)0x0) {
    mpp_destroy();
    p->ctx = (MppCtx)0x0;
  }
  if (*(long *)((long)arg + 0x70) != 0) {
    mpp_enc_cfg_deinit();
    *(undefined8 *)((long)arg + 0x70) = 0;
  }
  if (*(long *)((long)arg + 0x1278) != 0) {
    mpp_buffer_put_with_caller(*(long *)((long)arg + 0x1278),"enc_test");
    *(undefined8 *)((long)arg + 0x1278) = 0;
  }
  if (*(long *)((long)arg + 0x1280) != 0) {
    mpp_buffer_put_with_caller(*(long *)((long)arg + 0x1280),"enc_test");
    *(undefined8 *)((long)arg + 0x1280) = 0;
  }
  if (*(long *)((long)arg + 0x1288) != 0) {
    mpp_buffer_put_with_caller(*(long *)((long)arg + 0x1288),"enc_test");
    *(undefined8 *)((long)arg + 0x1288) = 0;
  }
  if (*(long *)((long)arg + 0x1158) != 0) {
    mpp_buffer_put_with_caller(*(long *)((long)arg + 0x1158),"enc_test");
    *(undefined8 *)((long)arg + 0x1158) = 0;
  }
  if (*(long *)((long)arg + 0x1270) != 0) {
    mpp_buffer_group_put();
    *(undefined8 *)((long)arg + 0x1270) = 0;
  }
  if (*(MppEncRoiCtx *)((long)arg + 0x12c0) != (MppEncRoiCtx)0x0) {
    mpp_enc_roi_deinit(*(MppEncRoiCtx *)((long)arg + 0x12c0));
    *(undefined8 *)((long)arg + 0x12c0) = 0;
  }
  if (*(long *)((long)arg + 0x12c8) != 0) {
    mpp_venc_kcfg_deinit();
  }
  test_ctx_deinit(p);
  return (void *)0x0;
}

Assistant:

void *enc_test(void *arg)
{
    MpiEncMultiCtxInfo *info = (MpiEncMultiCtxInfo *)arg;
    MpiEncTestArgs *cmd = info->cmd;
    MpiEncTestData *p = &info->ctx;
    MpiEncMultiCtxRet *enc_ret = &info->ret;
    MppPollType timeout = MPP_POLL_BLOCK;
    RK_U32 quiet = cmd->quiet;
    MPP_RET ret = MPP_OK;
    RK_S64 t_s = 0;
    RK_S64 t_e = 0;

    mpp_log_q(quiet, "%s start\n", info->name);

    ret = test_ctx_init(info);
    if (ret) {
        mpp_err_f("test data init failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = mpp_buffer_group_get_internal(&p->buf_grp, MPP_BUFFER_TYPE_DRM | MPP_BUFFER_FLAGS_CACHABLE);
    if (ret) {
        mpp_err_f("failed to get mpp buffer group ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = mpp_buffer_get(p->buf_grp, &p->frm_buf, p->frame_size + p->header_size);
    if (ret) {
        mpp_err_f("failed to get buffer for input frame ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = mpp_buffer_get(p->buf_grp, &p->pkt_buf, p->frame_size);
    if (ret) {
        mpp_err_f("failed to get buffer for output packet ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = mpp_buffer_get(p->buf_grp, &p->md_info, p->mdinfo_size);
    if (ret) {
        mpp_err_f("failed to get buffer for motion info output packet ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    // encoder demo
    ret = mpp_create(&p->ctx, &p->mpi);
    if (ret) {
        mpp_err("mpp_create failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    mpp_log_q(quiet, "%p encoder test start w %d h %d type %d\n",
              p->ctx, p->width, p->height, p->type);

    ret = p->mpi->control(p->ctx, MPP_SET_OUTPUT_TIMEOUT, &timeout);
    if (MPP_OK != ret) {
        mpp_err("mpi control set output timeout %d ret %d\n", timeout, ret);
        goto MPP_TEST_OUT;
    }

    if (cmd->kmpp_en)
        kmpp_cfg_init(info);

    ret = mpp_init(p->ctx, MPP_CTX_ENC, p->type);
    if (ret) {
        mpp_err("mpp_init failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = mpp_enc_cfg_init(&p->cfg);
    if (ret) {
        mpp_err_f("mpp_enc_cfg_init failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = p->mpi->control(p->ctx, MPP_ENC_GET_CFG, p->cfg);
    if (ret) {
        mpp_err_f("get enc cfg failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = test_mpp_enc_cfg_setup(info);
    if (ret) {
        mpp_err_f("test mpp setup failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    t_s = mpp_time();
    ret = test_mpp_run(info);
    t_e = mpp_time();
    if (ret) {
        mpp_err_f("test mpp run failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = p->mpi->reset(p->ctx);
    if (ret) {
        mpp_err("mpi->reset failed\n");
        goto MPP_TEST_OUT;
    }

    enc_ret->elapsed_time = t_e - t_s;
    enc_ret->frame_count = p->frame_count;
    enc_ret->stream_size = p->stream_size;
    enc_ret->frame_rate = (float)p->frame_count * 1000000 / enc_ret->elapsed_time;
    enc_ret->bit_rate = (p->stream_size * 8 * (p->fps_out_num / p->fps_out_den)) / p->frame_count;
    enc_ret->delay = p->first_pkt - p->first_frm;

MPP_TEST_OUT:
    if (p->ctx) {
        mpp_destroy(p->ctx);
        p->ctx = NULL;
    }

    if (p->cfg) {
        mpp_enc_cfg_deinit(p->cfg);
        p->cfg = NULL;
    }

    if (p->frm_buf) {
        mpp_buffer_put(p->frm_buf);
        p->frm_buf = NULL;
    }

    if (p->pkt_buf) {
        mpp_buffer_put(p->pkt_buf);
        p->pkt_buf = NULL;
    }

    if (p->md_info) {
        mpp_buffer_put(p->md_info);
        p->md_info = NULL;
    }

    if (p->osd_data.buf) {
        mpp_buffer_put(p->osd_data.buf);
        p->osd_data.buf = NULL;
    }

    if (p->buf_grp) {
        mpp_buffer_group_put(p->buf_grp);
        p->buf_grp = NULL;
    }

    if (p->roi_ctx) {
        mpp_enc_roi_deinit(p->roi_ctx);
        p->roi_ctx = NULL;
    }
    if (p->init_kcfg)
        mpp_venc_kcfg_deinit(p->init_kcfg);

    test_ctx_deinit(p);

    return NULL;
}